

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall cmComputeTargetDepends::DisplaySideEffects(cmComputeTargetDepends *this)

{
  uint uVar1;
  FILE *pFVar2;
  cmComputeTargetDepends *pcVar3;
  ulong uVar4;
  string *psVar5;
  pointer pTVar6;
  uint *puVar7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  cmGeneratorTarget *gt;
  cmComputeTargetDepends *local_50;
  map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
  *local_48;
  ulong local_40;
  ulong local_38;
  
  fwrite("The side effects are:\n",0x16,1,_stderr);
  uVar4 = ((long)(this->SideEffects).
                 super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->SideEffects).
                super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x60;
  local_40 = uVar4 & 0xffffffff;
  if ((int)uVar4 < 1) {
    local_40 = 0;
  }
  local_48 = &this->TargetIndex;
  uVar4 = 0;
  local_50 = this;
  while (pcVar3 = local_50, pFVar2 = _stderr, uVar4 != local_40) {
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((local_50->Targets).
                        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar4]);
    fprintf(pFVar2,"target %d is [%s]\n",uVar4 & 0xffffffff,(psVar5->_M_dataplus)._M_p);
    pTVar6 = (pcVar3->SideEffects).
             super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (*(size_t *)((long)&pTVar6[uVar4].CustomCommandSideEffects._M_t._M_impl + 0x28) != 0) {
      fwrite("  custom commands\n",0x12,1,_stderr);
      pTVar6 = (local_50->SideEffects).
               super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (p_Var9 = *(_Base_ptr *)
                     ((long)&pTVar6[uVar4].CustomCommandSideEffects._M_t._M_impl + 0x18);
          pFVar2 = _stderr,
          p_Var9 != (_Rb_tree_node_base *)
                    ((long)&pTVar6[uVar4].CustomCommandSideEffects._M_t._M_impl + 8U);
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
        gt = *(cmGeneratorTarget **)(p_Var9 + 1);
        puVar7 = (uint *)std::
                         map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
                         ::operator[](local_48,&gt);
        uVar1 = *puVar7;
        psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(gt);
        fprintf(pFVar2,"    from target %d [%s]\n",(ulong)uVar1,(psVar5->_M_dataplus)._M_p);
      }
      pTVar6 = (local_50->SideEffects).
               super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    local_38 = uVar4;
    for (p_Var9 = *(_Base_ptr *)((long)&pTVar6[uVar4].LanguageSideEffects._M_t._M_impl + 0x18);
        p_Var9 != (_Rb_tree_node_base *)((long)&pTVar6[uVar4].LanguageSideEffects._M_t._M_impl + 8U)
        ; p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
      fprintf(_stderr,"  language %s\n",*(undefined8 *)(p_Var9 + 1));
      for (p_Var8 = p_Var9[2]._M_right; pFVar2 = _stderr,
          p_Var8 != (_Rb_tree_node_base *)&p_Var9[2]._M_parent;
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        gt = *(cmGeneratorTarget **)(p_Var8 + 1);
        puVar7 = (uint *)std::
                         map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
                         ::operator[](local_48,&gt);
        uVar1 = *puVar7;
        psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(gt);
        fprintf(pFVar2,"    from target %d [%s]\n",(ulong)uVar1,(psVar5->_M_dataplus)._M_p);
      }
    }
    uVar4 = local_38 + 1;
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void cmComputeTargetDepends::DisplaySideEffects()
{
  fprintf(stderr, "The side effects are:\n");
  int n = static_cast<int>(this->SideEffects.size());
  for (int depender_index = 0; depender_index < n; ++depender_index) {
    cmGeneratorTarget const* depender = this->Targets[depender_index];
    fprintf(stderr, "target %d is [%s]\n", depender_index,
            depender->GetName().c_str());
    if (!this->SideEffects[depender_index].CustomCommandSideEffects.empty()) {
      fprintf(stderr, "  custom commands\n");
      for (auto const* gt :
           this->SideEffects[depender_index].CustomCommandSideEffects) {
        fprintf(stderr, "    from target %d [%s]\n", this->TargetIndex[gt],
                gt->GetName().c_str());
      }
    }
    for (auto const& it :
         this->SideEffects[depender_index].LanguageSideEffects) {
      fprintf(stderr, "  language %s\n", it.first.c_str());
      for (auto const* gt : it.second) {
        fprintf(stderr, "    from target %d [%s]\n", this->TargetIndex[gt],
                gt->GetName().c_str());
      }
    }
  }
  fprintf(stderr, "\n");
}